

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

string * base64_encode_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *input)

{
  uchar uVar1;
  undefined6 uVar2;
  byte bVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  ulong in_RAX;
  size_t j;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  size_t j_1;
  pointer puVar10;
  array<unsigned_char,_3UL> input_buffer;
  array<unsigned_char,_4UL> output_buffer;
  undefined8 local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  iVar6 = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_28 = in_RAX & 0xffffffffff000000;
  local_28 = (local_28 >> 0x10 & 0xffff) << 0x10;
  puVar10 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  while (uVar7 = (ulong)iVar6,
        puVar10 !=
        (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
    uVar1 = *puVar10;
    puVar10 = puVar10 + 1;
    iVar6 = iVar6 + 1;
    *(uchar *)((long)&local_28 + uVar7) = uVar1;
    uVar7 = local_28;
    if (iVar6 == 3) {
      bVar3 = (byte)local_28;
      bVar5 = local_28._1_1_;
      bVar8 = (byte)local_28 >> 2;
      local_28._0_5_ = CONCAT14(bVar8,(undefined4)local_28);
      uVar2 = CONCAT15(bVar3 << 4 | bVar5 >> 4,(undefined5)local_28);
      local_28._2_1_ = SUB81(uVar7,2);
      local_28 = CONCAT17(local_28._2_1_,CONCAT16((bVar5 & 0xf) << 2 | local_28._2_1_ >> 6,uVar2)) &
                 0x3fff3fffffffffff;
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,
                   base64_chars_abi_cxx11_._M_dataplus._M_p[*(byte *)((long)&local_28 + lVar9 + 4)])
        ;
      }
      iVar6 = 0;
    }
  }
  if (iVar6 != 0) {
    for (; uVar4 = local_28, uVar7 < 3; uVar7 = uVar7 + 1) {
      *(undefined1 *)((long)&local_28 + uVar7) = 0;
    }
    bVar3 = (byte)local_28;
    bVar5 = local_28._1_1_;
    bVar8 = (byte)local_28 >> 2;
    local_28._0_5_ = CONCAT14(bVar8,(undefined4)local_28);
    local_28._0_6_ = CONCAT15((bVar3 & 3) << 4 | bVar5 >> 4,(undefined5)local_28);
    uVar2 = (undefined6)local_28;
    local_28._2_1_ = SUB81(uVar4,2);
    bVar3 = local_28._2_1_;
    local_28._0_7_ = CONCAT16((bVar5 & 0xf) << 2 | local_28._2_1_ >> 6,uVar2);
    local_28 = CONCAT17(bVar3,(undefined7)local_28) & 0x3fffffffffffffff;
    for (lVar9 = 0; iVar6 + 1 != lVar9; lVar9 = lVar9 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,
                 base64_chars_abi_cxx11_._M_dataplus._M_p[*(byte *)((long)&local_28 + lVar9 + 4)]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_encode(const std::vector<uint8_t>& input)
{
    std::string encoded;
    std::array<uint8_t, 3> input_buffer {};
    std::array<uint8_t, 4> output_buffer {};

    int i = 0;
    auto it = input.begin();
    while(it != input.end())
    {
        input_buffer[i++] = *(it++);
        if (i == input_buffer.size())
        {
            output_buffer[0] = (input_buffer[0] & 0xfc) >> 2;
            output_buffer[1] = ((input_buffer[0] & 0x03) << 4) + ((input_buffer[1] & 0xf0) >> 4);
            output_buffer[2] = ((input_buffer[1] & 0x0f) << 2) + ((input_buffer[2] & 0xc0) >> 6);
            output_buffer[3] = input_buffer[2] & 0x3f;

            for(uint8_t byte : output_buffer)
                encoded += base64_chars[byte];
            i = 0;
        }
    }

    if (i)
    {
        for(size_t j=i ; j < input_buffer.size() ; ++j)
            input_buffer[j] = 0;

        output_buffer[0] = (input_buffer[0] & 0xfc) >> 2;
        output_buffer[1] = ((input_buffer[0] & 0x03) << 4) + ((input_buffer[1] & 0xf0) >> 4);
        output_buffer[2] = ((input_buffer[1] & 0x0f) << 2) + ((input_buffer[2] & 0xc0) >> 6);
        output_buffer[3] = input_buffer[2] & 0x3f;

        for (size_t j=0 ; j<i+1 ; ++j)
            encoded += base64_chars[output_buffer[j]];
    }

    return encoded;
}